

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::Script::Script(Script *this,Script *object)

{
  Script *object_local;
  Script *this_local;
  
  this->_vptr_Script = (_func_int **)&PTR__Script_00880270;
  ByteData::ByteData(&this->script_data_);
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&this->script_stack_);
  ByteData::operator=(&this->script_data_,&object->script_data_);
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::operator=
            (&this->script_stack_,&object->script_stack_);
  return;
}

Assistant:

Script::Script(const Script& object) {
  script_data_ = object.script_data_;
  script_stack_ = object.script_stack_;
}